

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_init_xtc(float p,float t,size_t min_keep,uint32_t seed)

{
  float fVar1;
  float *ctx;
  llama_sampler *plVar2;
  
  fVar1 = (float)get_rng_seed(seed);
  ctx = (float *)operator_new(0x13a0);
  *ctx = p;
  ctx[1] = t;
  *(size_t *)(ctx + 2) = min_keep;
  ctx[4] = (float)seed;
  ctx[5] = fVar1;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)(ctx + 6),(ulong)(uint)fVar1);
  plVar2 = llama_sampler_init(&llama_sampler_xtc_i,ctx);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_xtc(float p, float t, size_t min_keep, uint32_t seed) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_xtc_i,
        /* .ctx   = */ new llama_sampler_xtc {
            /* .probability   = */ p,
            /* .threshold     = */ t,
            /* .min_keep      = */ min_keep,
            /* .seed          = */ seed,
            /* .seed_cur      = */ seed_cur,
            /* .rng           = */ std::mt19937(seed_cur),
        }
    );
}